

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_OptionalKeywordBanned_Test::
ParseEditionsTest_OptionalKeywordBanned_Test(ParseEditionsTest_OptionalKeywordBanned_Test *this)

{
  ParseEditionsTest_OptionalKeywordBanned_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParseEditionsTest);
  (this->super_ParseEditionsTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParseEditionsTest_OptionalKeywordBanned_Test_02a11a20;
  return;
}

Assistant:

TEST_F(ParseEditionsTest, OptionalKeywordBanned) {
  ExpectHasErrors(
      R"schema(
        edition = "2023";
        message A {
          optional int32 b = 1;
        })schema",
      "3:10: Label \"optional\" is not supported in editions. By default, all "
      "singular fields have presence unless features.field_presence is set.\n");
}